

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::base::CircularQueue<perfetto::TracingServiceImpl::TriggerHistory>::erase_front
          (CircularQueue<perfetto::TracingServiceImpl::TriggerHistory> *this,size_t n)

{
  bool bVar1;
  size_t local_18;
  size_t n_local;
  CircularQueue<perfetto::TracingServiceImpl::TriggerHistory> *this_local;
  
  increment_generation(this);
  local_18 = n;
  while( true ) {
    bVar1 = false;
    if (local_18 != 0) {
      bVar1 = this->begin_ < this->end_;
    }
    if (!bVar1) break;
    Get(this,this->begin_);
    this->begin_ = this->begin_ + 1;
    local_18 = local_18 - 1;
  }
  return;
}

Assistant:

void erase_front(size_t n) {
    increment_generation();
    for (; n && (begin_ < end_); --n) {
      Get(begin_)->~T();
      begin_++;  // This needs to be its own statement, Get() checks begin_.
    }
  }